

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpPrepass::OnNameEntry
          (BinaryReaderObjdumpPrepass *this,NameSectionSubsection type,Index index,string_view name)

{
  switch(type) {
  case Type:
    ObjdumpNames::Set(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->type_names,index,name
                     );
    break;
  case Table:
    SetTableName(this,index,name);
    break;
  case Global:
    SetGlobalName(this,index,name);
    break;
  case DataSegment:
    SetSegmentName(this,index,name);
    break;
  case Last:
    SetTagName(this,index,name);
  }
  return (Result)Ok;
}

Assistant:

Result OnNameEntry(NameSectionSubsection type,
                     Index index,
                     std::string_view name) override {
    switch (type) {
      // TODO(sbc): remove OnFunctionName in favor of just using
      // OnNameEntry so that this works
      /*
      case NameSectionSubsection::Function:
        SetFunctionName(index, name);
        break;
      */
      case NameSectionSubsection::Type:
        SetTypeName(index, name);
        break;
      case NameSectionSubsection::Global:
        SetGlobalName(index, name);
        break;
      case NameSectionSubsection::Table:
        SetTableName(index, name);
        break;
      case NameSectionSubsection::DataSegment:
        SetSegmentName(index, name);
        break;
      case NameSectionSubsection::Tag:
        SetTagName(index, name);
        break;
      default:
        break;
    }
    return Result::Ok;
  }